

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

bool __thiscall
testing::internal::MaxBipartiteMatchState::TryAugment
          (MaxBipartiteMatchState *this,size_t ilhs,vector<char,_std::allocator<char>_> *seen)

{
  bool bVar1;
  size_t sVar2;
  reference pvVar3;
  reference pvVar4;
  ulong local_30;
  size_t irhs;
  vector<char,_std::allocator<char>_> *seen_local;
  size_t ilhs_local;
  MaxBipartiteMatchState *this_local;
  
  local_30 = 0;
  do {
    sVar2 = MatchMatrix::RhsSize(this->graph_);
    if (sVar2 <= local_30) {
      return false;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](seen,local_30);
    if ((*pvVar3 == '\0') && (bVar1 = MatchMatrix::HasEdge(this->graph_,ilhs,local_30), bVar1)) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](seen,local_30);
      *pvVar3 = '\x01';
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->right_,local_30);
      if (*pvVar4 == 0xffffffffffffffff) {
LAB_001b19fa:
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->left_,ilhs);
        *pvVar4 = local_30;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->right_,local_30);
        *pvVar4 = ilhs;
        return true;
      }
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->right_,local_30);
      bVar1 = TryAugment(this,*pvVar4,seen);
      if (bVar1) goto LAB_001b19fa;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool TryAugment(size_t ilhs, ::std::vector<char>* seen) {
    for (size_t irhs = 0; irhs < graph_->RhsSize(); ++irhs) {
      if ((*seen)[irhs]) continue;
      if (!graph_->HasEdge(ilhs, irhs)) continue;
      // There's an available edge from ilhs to irhs.
      (*seen)[irhs] = 1;
      // Next a search is performed to determine whether
      // this edge is a dead end or leads to the sink.
      //
      // right_[irhs] == kUnused means that there is residual flow from
      // right node irhs to the sink, so we can use that to finish this
      // flow path and return success.
      //
      // Otherwise there is residual flow to some ilhs. We push flow
      // along that path and call ourselves recursively to see if this
      // ultimately leads to sink.
      if (right_[irhs] == kUnused || TryAugment(right_[irhs], seen)) {
        // Add flow from left_[ilhs] to right_[irhs].
        left_[ilhs] = irhs;
        right_[irhs] = ilhs;
        return true;
      }
    }
    return false;
  }